

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PEFile.cpp
# Opt level: O2

SectionHdrWrapper * __thiscall
PEFile::addNewSection(PEFile *this,QString *name,bufsize_t r_size,bufsize_t v_size)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  long *plVar4;
  ulong uVar5;
  SectionHdrWrapper *pSVar6;
  long lVar7;
  size_t __n;
  bufsize_t local_128;
  bufsize_t local_120;
  IMAGE_SECTION_HEADER secHdr;
  WatchedLocker lock;
  WatchedLocker lock_1;
  
  if (v_size != 0 || r_size != 0) {
    WatchedLocker::WatchedLocker(&lock,&this->m_peMutex,false,"addNewSection");
    bVar1 = _canAddNewSection(this);
    if (bVar1) {
      if (v_size == 0) {
        v_size = r_size;
      }
      iVar2 = (*(this->super_MappedExe).super_Executable.super_AbstractByteBuffer.
                _vptr_AbstractByteBuffer[0xf])(this,1);
      iVar3 = (*(this->super_MappedExe).super_Executable.super_AbstractByteBuffer.
                _vptr_AbstractByteBuffer[0x10])(this,1);
      local_128 = buf_util::roundupToUnit
                            (CONCAT44(extraout_var,iVar2),CONCAT44(extraout_var_00,iVar3));
      iVar2 = (*(this->super_MappedExe).super_Executable.super_AbstractByteBuffer.
                _vptr_AbstractByteBuffer[0xf])(this,2);
      iVar3 = (*(this->super_MappedExe).super_Executable.super_AbstractByteBuffer.
                _vptr_AbstractByteBuffer[0x10])(this,2);
      local_120 = buf_util::roundupToUnit
                            (CONCAT44(extraout_var_01,iVar2),CONCAT44(extraout_var_02,iVar3));
      bVar1 = setVirtualSize(this,local_120 + v_size);
      if (!bVar1) {
        Logger::append(D_ERROR,"Failed to change virtual size to: %X",local_120 + v_size);
      }
      lVar7 = local_128 + r_size;
    }
    else {
      local_120 = 0;
      bVar1 = false;
      local_128 = 0;
      lVar7 = 0;
    }
    WatchedLocker::~WatchedLocker(&lock);
    if (bVar1 != false) {
      iVar2 = (*(this->super_MappedExe).super_Executable.super_AbstractByteBuffer.
                _vptr_AbstractByteBuffer[10])(this,lVar7);
      if ((char)iVar2 != '\0') {
        WatchedLocker::WatchedLocker(&lock_1,&this->m_peMutex,false,"addNewSection");
        iVar2 = (*(this->super_MappedExe).super_ExeWrappersContainer._vptr_ExeWrappersContainer[2])
                          (&(this->super_MappedExe).super_ExeWrappersContainer,5);
        if (CONCAT44(extraout_var_03,iVar2) == 0) {
          pSVar6 = (SectionHdrWrapper *)0x0;
        }
        else {
          pSVar6 = (SectionHdrWrapper *)0x0;
          plVar4 = (long *)__dynamic_cast(CONCAT44(extraout_var_03,iVar2),
                                          &ExeElementWrapper::typeinfo,&ExeNodeWrapper::typeinfo,0);
          if (plVar4 != (long *)0x0) {
            secHdr.NumberOfRelocations = 0;
            secHdr.NumberOfLinenumbers = 0;
            secHdr.Characteristics = 0;
            secHdr.SizeOfRawData = 0;
            secHdr.PointerToRawData = 0;
            secHdr.PointerToRelocations = 0;
            secHdr.PointerToLinenumbers = 0;
            secHdr.Name[0] = '\0';
            secHdr.Name[1] = '\0';
            secHdr.Name[2] = '\0';
            secHdr.Name[3] = '\0';
            secHdr.Name[4] = '\0';
            secHdr.Name[5] = '\0';
            secHdr.Name[6] = '\0';
            secHdr.Name[7] = '\0';
            secHdr.Misc = (anon_union_4_2_d8da8690_for_Misc)0x0;
            secHdr.VirtualAddress = 0;
            uVar5 = (name->d).size;
            __n = 8;
            if (uVar5 < 8) {
              __n = uVar5;
            }
            if (uVar5 != 0) {
              QString::toStdString_abi_cxx11_((string *)&lock,name);
              memcpy(&secHdr,lock.super_QMutexLocker<QMutex>.m,__n);
              std::__cxx11::string::~string((string *)&lock);
            }
            if (0xfffffffe < r_size) {
              r_size = 0xffffffff;
            }
            secHdr.PointerToRawData = (DWORD)local_128;
            secHdr.SizeOfRawData = (DWORD)r_size;
            uVar5 = 0xffffffff;
            if (v_size < 0xffffffff) {
              uVar5 = v_size;
            }
            secHdr.VirtualAddress = (DWORD)local_120;
            secHdr.Misc.PhysicalAddress = (DWORD)uVar5;
            SectionHdrWrapper::SectionHdrWrapper((SectionHdrWrapper *)&lock,this,&secHdr);
            lVar7 = (**(code **)(*plVar4 + 0x140))(plVar4,&lock);
            if (lVar7 == 0) {
              pSVar6 = (SectionHdrWrapper *)0x0;
            }
            else {
              pSVar6 = (SectionHdrWrapper *)
                       __dynamic_cast(lVar7,&ExeNodeWrapper::typeinfo,&SectionHdrWrapper::typeinfo,0
                                     );
            }
            SectionHdrWrapper::~SectionHdrWrapper((SectionHdrWrapper *)&lock);
          }
        }
        WatchedLocker::~WatchedLocker(&lock_1);
        return pSVar6;
      }
      Logger::append(D_ERROR,"Failed to resize");
      return (SectionHdrWrapper *)0x0;
    }
  }
  return (SectionHdrWrapper *)0x0;
}

Assistant:

SectionHdrWrapper* PEFile::addNewSection(QString name, bufsize_t r_size, bufsize_t v_size)
{
    if (!r_size && !v_size) return nullptr; //nothing to add
    
    bufsize_t newSize = 0;
    bufsize_t roundedRawEnd = 0;
    bufsize_t roundedVirtualEnd = 0;
    SectionHdrWrapper* secHdrWr = nullptr;
    { //scope0
        WatchedLocker lock(&m_peMutex, PE_SHOW_LOCK, __FUNCTION__);
        if (!_canAddNewSection()) {
            return nullptr;
        }

        if (!v_size) {
            v_size = r_size;
        }
        roundedRawEnd = buf_util::roundupToUnit(getMappedSize(Executable::RAW), getAlignment(Executable::RAW));
        roundedVirtualEnd = buf_util::roundupToUnit(getMappedSize(Executable::RVA), getAlignment(Executable::RVA));
        newSize = roundedRawEnd + r_size;
        const bufsize_t newVirtualSize = roundedVirtualEnd + v_size;
        if (setVirtualSize(newVirtualSize) == false) {
            Logger::append(Logger::D_ERROR, "Failed to change virtual size to: %X", newVirtualSize);
            return nullptr;
        }
    } //scope0
    
    // the PE file is resized and rewrapped:
    if (resize(newSize) == false) {
        Logger::append(Logger::D_ERROR, "Failed to resize");
        return nullptr;
    }
    
    { //scope1
        WatchedLocker lock(&m_peMutex, PE_SHOW_LOCK, __FUNCTION__);
        // fetch again after resize:
        ExeNodeWrapper* sec = dynamic_cast<ExeNodeWrapper*>(getWrapper(PEFile::WR_SECTIONS));
        if (!sec) {
            return nullptr;
        }

        IMAGE_SECTION_HEADER secHdr;
        ::memset(&secHdr, 0, sizeof(IMAGE_SECTION_HEADER));

        //name copy:
        const size_t nameLen = name.length();
        const size_t bufSize = sizeof(secHdr.Name);
        const size_t copySize = (nameLen < bufSize) ? nameLen : bufSize;
        if (copySize) {
            ::memcpy(secHdr.Name, name.toStdString().c_str(), copySize);
        }
        secHdr.PointerToRawData = static_cast<DWORD>(roundedRawEnd);
        secHdr.VirtualAddress = static_cast<DWORD>(roundedVirtualEnd);
        secHdr.SizeOfRawData = MASK_TO_DWORD(r_size);
        secHdr.Misc.VirtualSize = MASK_TO_DWORD(v_size);

        SectionHdrWrapper wr(this, &secHdr);
        secHdrWr = dynamic_cast<SectionHdrWrapper*>(sec->addEntry(&wr));
    } //!scope1
    return secHdrWr;
}